

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O3

void __thiscall
BRTS_XZ<RemSP>::InitCompressedData(BRTS_XZ<RemSP> *this,Data_Compressed *data_compressed)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Mat1b *pMVar6;
  uint64_t *puVar7;
  long lVar8;
  long *plVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  uint64_t *puVar15;
  ulong uVar16;
  uint64_t uVar17;
  uint64_t *puVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar6->field_0x8;
  if (0 < (long)iVar3) {
    uVar4 = *(uint *)&pMVar6->field_0xc;
    puVar7 = data_compressed->bits;
    iVar5 = data_compressed->data_width;
    lVar8 = *(long *)&pMVar6->field_0x10;
    plVar9 = *(long **)&pMVar6->field_0x48;
    uVar11 = uVar4 + 0x3f;
    if (-1 < (int)uVar4) {
      uVar11 = uVar4;
    }
    lVar19 = 0;
    puVar18 = puVar7;
    do {
      lVar10 = *plVar9;
      if ((int)uVar4 >> 6 < 1) {
        puVar15 = puVar7 + lVar19 * iVar5;
      }
      else {
        lVar12 = lVar10 * lVar19 + lVar8 + 0x20;
        lVar14 = 0;
        do {
          uVar16 = (ulong)(*(char *)(lVar12 + -0x20 + lVar14 * 8) != '\0');
          uVar13 = uVar16 + 2;
          if (*(char *)(lVar12 + -0x1f + lVar14 * 8) == '\0') {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 + 4;
          if (*(char *)(lVar12 + -0x1e + lVar14 * 8) == '\0') {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 + 8;
          if (*(char *)(lVar12 + -0x1d + lVar14 * 8) == '\0') {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x10;
          if (*(char *)(lVar12 + -0x1c + lVar14 * 8) == '\0') {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x20;
          if (*(char *)(lVar12 + -0x1b + lVar14 * 8) == '\0') {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x40;
          if (*(char *)(lVar12 + -0x1a + lVar14 * 8) == '\0') {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x80;
          if (*(char *)(lVar12 + -0x19 + lVar14 * 8) == '\0') {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x100;
          if (*(char *)(lVar12 + -0x18 + lVar14 * 8) == '\0') {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x200;
          if (*(char *)(lVar12 + -0x17 + lVar14 * 8) == '\0') {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x400;
          if (*(char *)(lVar12 + -0x16 + lVar14 * 8) == '\0') {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x800;
          if (*(char *)(lVar12 + -0x15 + lVar14 * 8) == '\0') {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x1000;
          if (*(char *)(lVar12 + -0x14 + lVar14 * 8) == '\0') {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x2000;
          if (*(char *)(lVar12 + -0x13 + lVar14 * 8) == '\0') {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x4000;
          if (*(char *)(lVar12 + -0x12 + lVar14 * 8) == '\0') {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x8000;
          if (*(char *)(lVar12 + -0x11 + lVar14 * 8) == '\0') {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x10000;
          if (*(char *)(lVar12 + -0x10 + lVar14 * 8) == '\0') {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x20000;
          if (*(char *)(lVar12 + -0xf + lVar14 * 8) == '\0') {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x40000;
          if (*(char *)(lVar12 + -0xe + lVar14 * 8) == '\0') {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x80000;
          if (*(char *)(lVar12 + -0xd + lVar14 * 8) == '\0') {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x100000;
          if (*(char *)(lVar12 + -0xc + lVar14 * 8) == '\0') {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x200000;
          if (*(char *)(lVar12 + -0xb + lVar14 * 8) == '\0') {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x400000;
          if (*(char *)(lVar12 + -10 + lVar14 * 8) == '\0') {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x800000;
          if (*(char *)(lVar12 + -9 + lVar14 * 8) == '\0') {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x1000000;
          if (*(char *)(lVar12 + -8 + lVar14 * 8) == '\0') {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x2000000;
          if (*(char *)(lVar12 + -7 + lVar14 * 8) == '\0') {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x4000000;
          if (*(char *)(lVar12 + -6 + lVar14 * 8) == '\0') {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x8000000;
          if (*(char *)(lVar12 + -5 + lVar14 * 8) == '\0') {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x10000000;
          if (*(char *)(lVar12 + -4 + lVar14 * 8) == '\0') {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x20000000;
          if (*(char *)(lVar12 + -3 + lVar14 * 8) == '\0') {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x40000000;
          if (*(char *)(lVar12 + -2 + lVar14 * 8) == '\0') {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x80000000;
          if (*(char *)(lVar12 + -1 + lVar14 * 8) == '\0') {
            uVar13 = uVar16;
          }
          pcVar1 = (char *)(lVar12 + lVar14 * 8);
          pcVar2 = (char *)(lVar12 + 0x10 + lVar14 * 8);
          auVar20[0] = -(*pcVar1 == '\0');
          auVar20[1] = -(pcVar1[1] == '\0');
          auVar20[2] = -(pcVar1[2] == '\0');
          auVar20[3] = -(pcVar1[3] == '\0');
          auVar20[4] = -(pcVar1[4] == '\0');
          auVar20[5] = -(pcVar1[5] == '\0');
          auVar20[6] = -(pcVar1[6] == '\0');
          auVar20[7] = -(pcVar1[7] == '\0');
          auVar20[8] = -(pcVar1[8] == '\0');
          auVar20[9] = -(pcVar1[9] == '\0');
          auVar20[10] = -(pcVar1[10] == '\0');
          auVar20[0xb] = -(pcVar1[0xb] == '\0');
          auVar20[0xc] = -(pcVar1[0xc] == '\0');
          auVar20[0xd] = -(pcVar1[0xd] == '\0');
          auVar20[0xe] = -(pcVar1[0xe] == '\0');
          auVar20[0xf] = -(pcVar1[0xf] == '\0');
          auVar21[0] = -(*pcVar2 == '\0');
          auVar21[1] = -(pcVar2[1] == '\0');
          auVar21[2] = -(pcVar2[2] == '\0');
          auVar21[3] = -(pcVar2[3] == '\0');
          auVar21[4] = -(pcVar2[4] == '\0');
          auVar21[5] = -(pcVar2[5] == '\0');
          auVar21[6] = -(pcVar2[6] == '\0');
          auVar21[7] = -(pcVar2[7] == '\0');
          auVar21[8] = -(pcVar2[8] == '\0');
          auVar21[9] = -(pcVar2[9] == '\0');
          auVar21[10] = -(pcVar2[10] == '\0');
          auVar21[0xb] = -(pcVar2[0xb] == '\0');
          auVar21[0xc] = -(pcVar2[0xc] == '\0');
          auVar21[0xd] = -(pcVar2[0xd] == '\0');
          auVar21[0xe] = -(pcVar2[0xe] == '\0');
          auVar21[0xf] = -(pcVar2[0xf] == '\0');
          uVar16 = uVar13 | 0x100000000;
          if ((auVar20 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x200000000;
          if ((auVar20 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x400000000;
          if ((auVar20 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x800000000;
          if ((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x1000000000;
          if ((auVar20 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x2000000000;
          if ((auVar20 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x4000000000;
          if ((auVar20 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x8000000000;
          if ((auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x10000000000;
          if ((auVar20 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x20000000000;
          if ((auVar20 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x40000000000;
          if ((auVar20 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x80000000000;
          if ((auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x100000000000;
          if ((auVar20 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x200000000000;
          if ((auVar20 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x400000000000;
          if ((auVar20 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x800000000000;
          if (pcVar1[0xf] == '\0') {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x1000000000000;
          if ((auVar21 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x2000000000000;
          if ((auVar21 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x4000000000000;
          if ((auVar21 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x8000000000000;
          if ((auVar21 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x10000000000000;
          if ((auVar21 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x20000000000000;
          if ((auVar21 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x40000000000000;
          if ((auVar21 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x80000000000000;
          if ((auVar21 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x100000000000000;
          if ((auVar21 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x200000000000000;
          if ((auVar21 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x400000000000000;
          if ((auVar21 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x800000000000000;
          if ((auVar21 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x1000000000000000;
          if ((auVar21 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x2000000000000000;
          if ((auVar21 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar13 = uVar16;
          }
          uVar16 = uVar13 | 0x4000000000000000;
          if ((auVar21 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar16 = uVar13;
          }
          uVar13 = uVar16 | 0x8000000000000000;
          if (pcVar2[0xf] == '\0') {
            uVar13 = uVar16;
          }
          *(ulong *)((long)puVar18 + lVar14) = uVar13;
          lVar14 = lVar14 + 8;
        } while ((ulong)(uint)((int)uVar4 >> 6) * 8 - lVar14 != 0);
        puVar15 = (uint64_t *)(lVar14 + (long)puVar18);
      }
      if ((int)uVar4 % 0x40 < 1) {
        uVar17 = 0;
      }
      else {
        uVar13 = 0;
        uVar17 = 0;
        do {
          uVar16 = 0;
          if (*(char *)(lVar10 * lVar19 + (int)(uVar11 & 0xffffffc0) + lVar8 + uVar13) != '\0') {
            uVar16 = 1L << ((byte)uVar13 & 0x3f);
          }
          uVar17 = uVar17 | uVar16;
          uVar13 = uVar13 + 1;
        } while ((uint)((int)uVar4 % 0x40) != uVar13);
      }
      *puVar15 = uVar17;
      lVar19 = lVar19 + 1;
      puVar18 = puVar18 + iVar5;
    } while (lVar19 != iVar3);
  }
  return;
}

Assistant:

void InitCompressedData(Data_Compressed& data_compressed) {
        int w(img_.cols);
        int h(img_.rows);

        for (int i = 0; i < h; i++) {
            uint64_t* mbits = data_compressed[i];
            uchar* source = img_.ptr<uchar>(i);
            for (int j = 0; j < w >> 6; j++) {
                uchar* base = source + (j << 6);
                uint64_t obits = 0;
                if (base[0]) obits |= 0x0000000000000001;
                if (base[1]) obits |= 0x0000000000000002;
                if (base[2]) obits |= 0x0000000000000004;
                if (base[3]) obits |= 0x0000000000000008;
                if (base[4]) obits |= 0x0000000000000010;
                if (base[5]) obits |= 0x0000000000000020;
                if (base[6]) obits |= 0x0000000000000040;
                if (base[7]) obits |= 0x0000000000000080;
                if (base[8]) obits |= 0x0000000000000100;
                if (base[9]) obits |= 0x0000000000000200;
                if (base[10]) obits |= 0x0000000000000400;
                if (base[11]) obits |= 0x0000000000000800;
                if (base[12]) obits |= 0x0000000000001000;
                if (base[13]) obits |= 0x0000000000002000;
                if (base[14]) obits |= 0x0000000000004000;
                if (base[15]) obits |= 0x0000000000008000;
                if (base[16]) obits |= 0x0000000000010000;
                if (base[17]) obits |= 0x0000000000020000;
                if (base[18]) obits |= 0x0000000000040000;
                if (base[19]) obits |= 0x0000000000080000;
                if (base[20]) obits |= 0x0000000000100000;
                if (base[21]) obits |= 0x0000000000200000;
                if (base[22]) obits |= 0x0000000000400000;
                if (base[23]) obits |= 0x0000000000800000;
                if (base[24]) obits |= 0x0000000001000000;
                if (base[25]) obits |= 0x0000000002000000;
                if (base[26]) obits |= 0x0000000004000000;
                if (base[27]) obits |= 0x0000000008000000;
                if (base[28]) obits |= 0x0000000010000000;
                if (base[29]) obits |= 0x0000000020000000;
                if (base[30]) obits |= 0x0000000040000000;
                if (base[31]) obits |= 0x0000000080000000;
                if (base[32]) obits |= 0x0000000100000000;
                if (base[33]) obits |= 0x0000000200000000;
                if (base[34]) obits |= 0x0000000400000000;
                if (base[35]) obits |= 0x0000000800000000;
                if (base[36]) obits |= 0x0000001000000000;
                if (base[37]) obits |= 0x0000002000000000;
                if (base[38]) obits |= 0x0000004000000000;
                if (base[39]) obits |= 0x0000008000000000;
                if (base[40]) obits |= 0x0000010000000000;
                if (base[41]) obits |= 0x0000020000000000;
                if (base[42]) obits |= 0x0000040000000000;
                if (base[43]) obits |= 0x0000080000000000;
                if (base[44]) obits |= 0x0000100000000000;
                if (base[45]) obits |= 0x0000200000000000;
                if (base[46]) obits |= 0x0000400000000000;
                if (base[47]) obits |= 0x0000800000000000;
                if (base[48]) obits |= 0x0001000000000000;
                if (base[49]) obits |= 0x0002000000000000;
                if (base[50]) obits |= 0x0004000000000000;
                if (base[51]) obits |= 0x0008000000000000;
                if (base[52]) obits |= 0x0010000000000000;
                if (base[53]) obits |= 0x0020000000000000;
                if (base[54]) obits |= 0x0040000000000000;
                if (base[55]) obits |= 0x0080000000000000;
                if (base[56]) obits |= 0x0100000000000000;
                if (base[57]) obits |= 0x0200000000000000;
                if (base[58]) obits |= 0x0400000000000000;
                if (base[59]) obits |= 0x0800000000000000;
                if (base[60]) obits |= 0x1000000000000000;
                if (base[61]) obits |= 0x2000000000000000;
                if (base[62]) obits |= 0x4000000000000000;
                if (base[63]) obits |= 0x8000000000000000;
                *mbits = obits, mbits++;
            }
            uint64_t obits_final = 0;
            int jbase = w - (w % 64);
            for (int j = 0; j < w % 64; j++) {
                if (source[jbase + j]) obits_final |= ((uint64_t)1 << j);
            }
            *mbits = obits_final;
        }
    }